

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::TimeZoneFormat::parseOffsetISO8601
          (TimeZoneFormat *this,UnicodeString *text,ParsePosition *pos,UBool extendedOnly,
          UBool *hasDigitOffset)

{
  char16_t cVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  undefined1 local_80 [4];
  int32_t tmpOffset;
  ParsePosition posBasic;
  int32_t local_5c;
  undefined1 local_58 [4];
  int32_t offset;
  ParsePosition posOffset;
  int32_t sign;
  UChar firstChar;
  int32_t start;
  UBool *hasDigitOffset_local;
  UBool extendedOnly_local;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  TimeZoneFormat *this_local;
  
  if (hasDigitOffset != (UBool *)0x0) {
    *hasDigitOffset = '\0';
  }
  iVar2 = ParsePosition::getIndex(pos);
  iVar3 = UnicodeString::length(text);
  if (iVar2 < iVar3) {
    cVar1 = UnicodeString::charAt(text,iVar2);
    if ((cVar1 == L'Z') || (cVar1 == L'z')) {
      ParsePosition::setIndex(pos,iVar2 + 1);
      this_local._4_4_ = 0;
    }
    else {
      posOffset.errorIndex = 1;
      if (cVar1 == L'+') {
        posOffset.errorIndex = 1;
      }
      else {
        if (cVar1 != L'-') {
          ParsePosition::setErrorIndex(pos,iVar2);
          return 0;
        }
        posOffset.errorIndex = -1;
      }
      ParsePosition::ParsePosition((ParsePosition *)local_58,iVar2 + 1);
      local_5c = parseAsciiOffsetFields(text,(ParsePosition *)local_58,L':',FIELDS_H,FIELDS_HMS);
      iVar3 = ParsePosition::getErrorIndex((ParsePosition *)local_58);
      if (((iVar3 == -1) && (extendedOnly == '\0')) &&
         (iVar3 = ParsePosition::getIndex((ParsePosition *)local_58), iVar3 - iVar2 < 4)) {
        ParsePosition::ParsePosition((ParsePosition *)local_80,iVar2 + 1);
        iVar3 = parseAbuttingAsciiOffsetFields
                          (text,(ParsePosition *)local_80,FIELDS_H,FIELDS_HMS,'\0');
        iVar4 = ParsePosition::getErrorIndex((ParsePosition *)local_80);
        if (iVar4 == -1) {
          iVar4 = ParsePosition::getIndex((ParsePosition *)local_80);
          iVar5 = ParsePosition::getIndex((ParsePosition *)local_58);
          if (iVar5 < iVar4) {
            iVar4 = ParsePosition::getIndex((ParsePosition *)local_80);
            ParsePosition::setIndex((ParsePosition *)local_58,iVar4);
            local_5c = iVar3;
          }
        }
        ParsePosition::~ParsePosition((ParsePosition *)local_80);
      }
      iVar3 = ParsePosition::getErrorIndex((ParsePosition *)local_58);
      if (iVar3 == -1) {
        iVar2 = ParsePosition::getIndex((ParsePosition *)local_58);
        ParsePosition::setIndex(pos,iVar2);
        if (hasDigitOffset != (UBool *)0x0) {
          *hasDigitOffset = '\x01';
        }
        this_local._4_4_ = posOffset.errorIndex * local_5c;
      }
      else {
        ParsePosition::setErrorIndex(pos,iVar2);
        this_local._4_4_ = 0;
      }
      ParsePosition::~ParsePosition((ParsePosition *)local_58);
    }
  }
  else {
    ParsePosition::setErrorIndex(pos,iVar2);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int32_t
TimeZoneFormat::parseOffsetISO8601(const UnicodeString& text, ParsePosition& pos, UBool extendedOnly, UBool* hasDigitOffset /* = NULL */) const {
    if (hasDigitOffset) {
        *hasDigitOffset = FALSE;
    }
    int32_t start = pos.getIndex();
    if (start >= text.length()) {
        pos.setErrorIndex(start);
        return 0;
    }

    UChar firstChar = text.charAt(start);
    if (firstChar == ISO8601_UTC || firstChar == (UChar)(ISO8601_UTC + 0x20)) {
        // "Z" (or "z") - indicates UTC
        pos.setIndex(start + 1);
        return 0;
    }

    int32_t sign = 1;
    if (firstChar == PLUS) {
        sign = 1;
    } else if (firstChar == MINUS) {
        sign = -1;
    } else {
        // Not an ISO 8601 offset string
        pos.setErrorIndex(start);
        return 0;
    }
    ParsePosition posOffset(start + 1);
    int32_t offset = parseAsciiOffsetFields(text, posOffset, ISO8601_SEP, FIELDS_H, FIELDS_HMS);
    if (posOffset.getErrorIndex() == -1 && !extendedOnly && (posOffset.getIndex() - start <= 3)) {
        // If the text is successfully parsed as extended format with the options above, it can be also parsed
        // as basic format. For example, "0230" can be parsed as offset 2:00 (only first digits are valid for
        // extended format), but it can be parsed as offset 2:30 with basic format. We use longer result.
        ParsePosition posBasic(start + 1);
        int32_t tmpOffset = parseAbuttingAsciiOffsetFields(text, posBasic, FIELDS_H, FIELDS_HMS, FALSE);
        if (posBasic.getErrorIndex() == -1 && posBasic.getIndex() > posOffset.getIndex()) {
            offset = tmpOffset;
            posOffset.setIndex(posBasic.getIndex());
        }
    }

    if (posOffset.getErrorIndex() != -1) {
        pos.setErrorIndex(start);
        return 0;
    }

    pos.setIndex(posOffset.getIndex());
    if (hasDigitOffset) {
        *hasDigitOffset = TRUE;
    }
    return sign * offset;
}